

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

Graph * __thiscall
spoa::Graph::Subgraph
          (Graph *__return_storage_ptr__,Graph *this,uint32_t begin,uint32_t end,
          vector<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_>
          *subgraph_to_graph)

{
  Node *head;
  bool bVar1;
  invalid_argument *this_00;
  const_reference pvVar2;
  pointer pNVar3;
  pointer pNVar4;
  size_type sVar5;
  reference pvVar6;
  reference ppNVar7;
  reference ppNVar8;
  reference ppEVar9;
  reference ppNVar10;
  reference rVar11;
  Node **kt_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *__range2_1;
  Edge **kt;
  iterator __end2;
  iterator __begin2;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *__range2;
  value_type jt;
  _Bit_type local_f0;
  reference local_e8;
  unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_> *it_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
  *__range1_1;
  _Bit_type local_c0;
  reference local_b8;
  unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_> *it;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
  *__range1;
  value_type local_90;
  undefined1 local_88 [8];
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> graph_to_subgraph;
  undefined1 local_60 [8];
  vector<bool,_std::allocator<bool>_> is_in_subgraph;
  vector<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_>
  *subgraph_to_graph_local;
  uint32_t end_local;
  uint32_t begin_local;
  Graph *this_local;
  Graph *subgraph;
  
  if (subgraph_to_graph ==
      (vector<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_> *)0x0) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"[spoa::Graph::Subgraph] error: invalid ptr to subgraph_to_graph");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pvVar2 = std::
           vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
           ::operator[](&this->nodes_,(ulong)end);
  pNVar3 = std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>::get(pvVar2);
  pvVar2 = std::
           vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
           ::operator[](&this->nodes_,(ulong)begin);
  pNVar4 = std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>::get(pvVar2);
  ExtractSubgraph((vector<bool,_std::allocator<bool>_> *)local_60,this,pNVar3,pNVar4);
  Graph(__return_storage_ptr__);
  __return_storage_ptr__->num_codes_ = this->num_codes_;
  std::vector<int,_std::allocator<int>_>::operator=(&__return_storage_ptr__->coder_,&this->coder_);
  std::vector<int,_std::allocator<int>_>::operator=
            (&__return_storage_ptr__->decoder_,&this->decoder_);
  std::vector<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_>::clear
            (subgraph_to_graph);
  sVar5 = std::
          vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
          ::size(&this->nodes_);
  graph_to_subgraph.super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_>::resize
            (subgraph_to_graph,sVar5,
             (value_type *)
             &graph_to_subgraph.
              super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sVar5 = std::
          vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
          ::size(&this->nodes_);
  local_90 = (value_type)0x0;
  std::allocator<spoa::Graph::Node_*>::allocator
            ((allocator<spoa::Graph::Node_*> *)((long)&__range1 + 7));
  std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::vector
            ((vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *)local_88,sVar5,
             &local_90,(allocator<spoa::Graph::Node_*> *)((long)&__range1 + 7));
  std::allocator<spoa::Graph::Node_*>::~allocator
            ((allocator<spoa::Graph::Node_*> *)((long)&__range1 + 7));
  __end1 = std::
           vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
           ::begin(&this->nodes_);
  it = (unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_> *)
       std::
       vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
       ::end(&this->nodes_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_*,_std::vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>_>
                                     *)&it), bVar1) {
    local_b8 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_*,_std::vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>_>
               ::operator*(&__end1);
    pNVar3 = std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>::operator->
                       (local_b8);
    rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)local_60,(ulong)pNVar3->id);
    local_c0 = rVar11._M_mask;
    __range1_1 = (vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                  *)rVar11._M_p;
    bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&__range1_1);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      pNVar3 = std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>::
               operator->(local_b8);
      AddNode(__return_storage_ptr__,pNVar3->code);
      pvVar6 = std::
               vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
               ::back(&__return_storage_ptr__->nodes_);
      pNVar3 = std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>::get
                         (pvVar6);
      pNVar4 = std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>::
               operator->(local_b8);
      ppNVar8 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::operator[]
                          ((vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *)
                           local_88,(ulong)pNVar4->id);
      *ppNVar8 = pNVar3;
      pNVar3 = std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>::get
                         (local_b8);
      pvVar6 = std::
               vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
               ::back(&__return_storage_ptr__->nodes_);
      pNVar4 = std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>::
               operator->(pvVar6);
      ppNVar7 = std::vector<const_spoa::Graph::Node_*,_std::allocator<const_spoa::Graph::Node_*>_>::
                operator[](subgraph_to_graph,(ulong)pNVar4->id);
      *ppNVar7 = pNVar3;
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_*,_std::vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::
             vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
             ::begin(&this->nodes_);
  it_1 = (unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_> *)
         std::
         vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
         ::end(&this->nodes_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_*,_std::vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>_>
                             *)&it_1), bVar1) {
    local_e8 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_*,_std::vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>_>
               ::operator*(&__end1_1);
    pNVar3 = std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>::operator->
                       (local_e8);
    rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)local_60,(ulong)pNVar3->id);
    local_f0 = rVar11._M_mask;
    jt = (value_type)rVar11._M_p;
    bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&jt);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      pNVar3 = std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>::
               operator->(local_e8);
      ppNVar8 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::operator[]
                          ((vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *)
                           local_88,(ulong)pNVar3->id);
      head = *ppNVar8;
      pNVar3 = std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>::
               operator->(local_e8);
      __end2 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::begin
                         (&pNVar3->inedges);
      kt = (Edge **)std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::end
                              (&pNVar3->inedges);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<spoa::Graph::Edge_**,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
                                         *)&kt), bVar1) {
        ppEVar9 = __gnu_cxx::
                  __normal_iterator<spoa::Graph::Edge_**,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
                  ::operator*(&__end2);
        ppNVar8 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::operator[]
                            ((vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *)
                             local_88,(ulong)(*ppEVar9)->tail->id);
        if (*ppNVar8 != (value_type)0x0) {
          ppNVar8 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::
                    operator[]((vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *)
                               local_88,(ulong)(*ppEVar9)->tail->id);
          AddEdge(__return_storage_ptr__,*ppNVar8,head,(uint32_t)(*ppEVar9)->weight);
        }
        __gnu_cxx::
        __normal_iterator<spoa::Graph::Edge_**,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
        ::operator++(&__end2);
      }
      pNVar3 = std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>::
               operator->(local_e8);
      __end2_1 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::begin
                           (&pNVar3->aligned_nodes);
      kt_1 = (Node **)std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::end
                                (&pNVar3->aligned_nodes);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                                 *)&kt_1), bVar1) {
        ppNVar10 = __gnu_cxx::
                   __normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                   ::operator*(&__end2_1);
        ppNVar8 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::operator[]
                            ((vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *)
                             local_88,(ulong)(*ppNVar10)->id);
        if (*ppNVar8 != (value_type)0x0) {
          ppNVar8 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::
                    operator[]((vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *)
                               local_88,(ulong)(*ppNVar10)->id);
          std::vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
          emplace_back<spoa::Graph::Node*&>
                    ((vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)
                     &head->aligned_nodes,ppNVar8);
        }
        __gnu_cxx::
        __normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
        ::operator++(&__end2_1);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_*,_std::vector<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>_>
    ::operator++(&__end1_1);
  }
  TopologicalSort(__return_storage_ptr__);
  std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::~vector
            ((vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *)local_88);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_60)
  ;
  return __return_storage_ptr__;
}

Assistant:

Graph Graph::Subgraph(
    std::uint32_t begin,
    std::uint32_t end,
    std::vector<const Node*>* subgraph_to_graph) const {
  if (!subgraph_to_graph) {
    throw std::invalid_argument(
        "[spoa::Graph::Subgraph] error: invalid ptr to subgraph_to_graph");
  }

  auto is_in_subgraph = ExtractSubgraph(nodes_[end].get(), nodes_[begin].get());

  // init subgraph
  Graph subgraph{};
  subgraph.num_codes_ = num_codes_;
  subgraph.coder_ = coder_;
  subgraph.decoder_ = decoder_;
  // subgraph.sequences_ = TODO(rvaser) maybe add sequences

  // create a map from subgraph nodes to graph nodes and vice versa
  subgraph_to_graph->clear();
  subgraph_to_graph->resize(nodes_.size(), nullptr);

  std::vector<Node*> graph_to_subgraph(nodes_.size(), nullptr);

  for (const auto& it : nodes_) {
    if (!is_in_subgraph[it->id]) {
      continue;
    }
    subgraph.AddNode(it->code);
    graph_to_subgraph[it->id] = subgraph.nodes_.back().get();
    (*subgraph_to_graph)[subgraph.nodes_.back()->id] = it.get();
  }

  // connect nodes
  for (const auto& it : nodes_) {
    if (!is_in_subgraph[it->id]) {
      continue;
    }
    auto jt = graph_to_subgraph[it->id];
    for (const auto& kt : it->inedges) {
      if (graph_to_subgraph[kt->tail->id]) {
        subgraph.AddEdge(graph_to_subgraph[kt->tail->id], jt, kt->weight);
      }
    }
    for (const auto& kt : it->aligned_nodes) {
      if (graph_to_subgraph[kt->id]) {
        jt->aligned_nodes.emplace_back(graph_to_subgraph[kt->id]);
      }
    }
  }

  subgraph.TopologicalSort();

  return subgraph;
}